

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetVisibleRotation
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  AActor *pAVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  PClass *pPVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003e4577;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e4567:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e4577:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1a76,
                  "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_003e436b;
    pPVar4 = (pAVar5->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar5->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar8 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar1 && bVar8) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e4577;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_003e4567;
LAB_003e436b:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e4643:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a77,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_50 = param[1].field_0.field_1.a;
LAB_003e43cd:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e4681:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a78,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_38 = param[2].field_0.field_1.a;
LAB_003e43e4:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e45f3:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a79,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = param[3].field_0.field_1.a;
LAB_003e43fb:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e45d4:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a7a,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_48 = param[4].field_0.field_1.a;
LAB_003e4412:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e45b5:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a7b,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar6 = param[5].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e4643;
    }
    local_50 = param[1].field_0.field_1.a;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e43cd;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e4681;
    }
    local_38 = param[2].field_0.field_1.a;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e43e4;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e45f3;
    }
    local_40 = param[3].field_0.field_1.a;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e43fb;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e45d4;
    }
    local_48 = param[4].field_0.field_1.a;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003e4412;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e45b5;
    }
    uVar6 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e4596;
      }
      goto LAB_003e4432;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e4596:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1a7c,
                  "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e4432:
  pAVar5 = COPY_AAPTR(pAVar5,param[6].field_0.i);
  if (pAVar5 == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a82,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar3 = 0;
  }
  else {
    if ((uVar6 & 1) == 0) {
      (pAVar5->VisibleStartAngle).Degrees = (double)local_50;
    }
    if ((uVar6 & 2) == 0) {
      (pAVar5->VisibleEndAngle).Degrees = (double)local_38;
    }
    if ((uVar6 & 4) == 0) {
      (pAVar5->VisibleStartPitch).Degrees = (double)local_40;
    }
    if ((uVar6 & 8) == 0) {
      (pAVar5->VisibleEndPitch).Degrees = (double)local_48;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a96,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar3 = 1;
  }
  if (ret->RegType != '\0') {
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  *(undefined4 *)ret->Location = uVar3;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetVisibleRotation)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF(anglestart)
	PARAM_ANGLE_DEF(angleend)	
	PARAM_ANGLE_DEF(pitchstart)
	PARAM_ANGLE_DEF(pitchend)	
	PARAM_INT_DEF(flags)		
	PARAM_INT_DEF(ptr)			

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}
		
	if (!(flags & VRF_NOANGLESTART))
	{
		mobj->VisibleStartAngle = anglestart;
	}
	if (!(flags & VRF_NOANGLEEND))
	{
		mobj->VisibleEndAngle = angleend;
	}
	if (!(flags & VRF_NOPITCHSTART))
	{
		mobj->VisibleStartPitch = pitchstart;
	}
	if (!(flags & VRF_NOPITCHEND))
	{
		mobj->VisibleEndPitch = pitchend;
	}

	ACTION_RETURN_BOOL(true);
}